

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::tree_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::tree_node<char,_false>_>::operator=
          (ref<immutable::rrb_details::tree_node<char,_false>_> *this,
          ref<immutable::rrb_details::tree_node<char,_false>_> *r)

{
  ref<immutable::rrb_details::tree_node<char,_false>_> local_20;
  ref<immutable::rrb_details::tree_node<char,_false>_> temp;
  ref<immutable::rrb_details::tree_node<char,_false>_> *r_local;
  ref<immutable::rrb_details::tree_node<char,_false>_> *this_local;
  
  temp.ptr = (tree_node<char,_false> *)r;
  ref(&local_20,r);
  swap(this,&local_20);
  ~ref(&local_20);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }